

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

size_t rtosc_print_arg_vals
                 (rtosc_arg_val_t *args,size_t n,char *buffer,size_t bs,rtosc_print_options *opt,
                 int cols_used)

{
  char cVar1;
  char *pcVar2;
  size_t __n;
  long lVar3;
  char *__dest;
  char *__src;
  rtosc_arg_val_t *arg;
  size_t sVar4;
  int32_t iVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  rtosc_arg_val_t *prev_arg_if_range;
  rtosc_arg_val_t *prVar10;
  undefined1 *puVar11;
  rtosc_print_options *opt_00;
  char *dest;
  size_t sStack_a0;
  rtosc_arg_val_t *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  int32_t local_6c;
  rtosc_arg_val_t *local_68;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  size_t local_48;
  rtosc_print_options *local_40;
  int local_34 [2];
  int cols_used_local;
  
  local_50 = (ulong)(cols_used != 0);
  puVar11 = _compoundliteral;
  if (opt != (rtosc_print_options *)0x0) {
    puVar11 = &opt->lossless;
  }
  sStack_a0 = 0x10bec2;
  local_68 = args;
  local_48 = bs;
  local_34[0] = cols_used;
  local_78 = strlen(((rtosc_print_options *)puVar11)->sep);
  dest = buffer + -1;
  lVar3 = -(n * 0x18 + 0xf & 0xfffffffffffffff0);
  local_98 = (rtosc_arg_val_t *)((long)&local_98 + lVar3);
  local_58 = 0;
  uVar9 = 0;
  local_60 = n;
  local_40 = (rtosc_print_options *)puVar11;
  do {
    local_88 = dest + 5;
    local_80 = dest + 1;
    opt_00 = local_40;
    local_90 = dest;
    do {
      arg = local_68;
      prVar10 = local_98;
      if (n < uVar9 || n - uVar9 == 0) {
        return local_58;
      }
      *(undefined8 *)((long)&sStack_a0 + lVar3) = 0x10bf37;
      local_6c = rtosc_convert_to_range(arg,n - uVar9,prVar10,opt_00);
      sVar4 = local_48;
      if (local_6c == 0) {
        prVar10 = arg;
      }
      prev_arg_if_range = arg + -1;
      if (uVar9 == 0) {
        prev_arg_if_range = (rtosc_arg_val_t *)0x0;
      }
      *(undefined8 *)((long)&sStack_a0 + lVar3) = 0x10bf64;
      sVar6 = rtosc_print_arg_val(prVar10,buffer,sVar4,opt_00,local_34,prev_arg_if_range);
      local_58 = local_58 + sVar6;
      dest = buffer + sVar6;
      local_48 = sVar4 - sVar6;
      cVar1 = arg->type;
      *(undefined8 *)((long)&sStack_a0 + lVar3) = 5;
      __n = *(size_t *)((long)&sStack_a0 + lVar3);
      *(undefined8 *)((long)&sStack_a0 + lVar3) = 0x10bf89;
      pvVar7 = memchr("-asb",(int)cVar1,__n);
      n = local_60;
      __src = local_80;
      __dest = local_88;
      pcVar2 = local_90;
      uVar8 = local_50;
      if (pvVar7 == (void *)0x0) {
        uVar8 = (ulong)((int)local_50 + 1);
        if ((local_40->linelength < local_34[0]) && (0 < (int)local_50)) {
          *local_90 = '\n';
          *(undefined8 *)((long)&sStack_a0 + lVar3) = 0x10bfce;
          memmove(__dest,__src,sVar6 + 1);
          pcVar2[1] = ' ';
          pcVar2[2] = ' ';
          pcVar2[3] = ' ';
          pcVar2[4] = ' ';
          local_34[0] = (int)sVar6 + 4;
          local_58 = local_58 + 4;
          dest = dest + 4;
          local_48 = local_48 - 4;
          *(undefined8 *)((long)&sStack_a0 + lVar3) = 1;
          uVar8 = *(ulong *)((long)&sStack_a0 + lVar3);
        }
      }
      local_50 = uVar8;
      opt_00 = local_40;
      prVar10 = local_68;
      iVar5 = local_6c;
      if (local_6c == 0) {
        *(undefined8 *)((long)&sStack_a0 + lVar3) = 0x10c006;
        iVar5 = next_arg_offset(prVar10);
      }
      sVar4 = local_48;
      uVar9 = uVar9 + (long)iVar5;
      local_68 = local_68 + iVar5;
      buffer = dest;
    } while (n <= uVar9);
    pcVar2 = opt_00->sep;
    *(undefined8 *)((long)&sStack_a0 + lVar3) = 0x10c03a;
    fast_strcpy(dest,pcVar2,sVar4);
    local_34[0] = local_34[0] + (int)local_78;
    local_58 = local_58 + local_78;
    buffer = dest + local_78;
    local_48 = sVar4 - local_78;
  } while( true );
}

Assistant:

size_t rtosc_print_arg_vals(const rtosc_arg_val_t *args, size_t n,
                            char *buffer, size_t bs,
                            const rtosc_print_options *opt, int cols_used)
{
    size_t wrt=0;
    int args_written_this_line = (cols_used) ? 1 : 0;
    if(!opt)
        opt = default_print_options;
    size_t sep_len = strlen(opt->sep);
    char* last_sep = buffer - 1;
    STACKALLOC(rtosc_arg_val_t, args_converted, n); // only used for range conversion

    for(size_t i = 0; i < n;)
    {
        int32_t conv = rtosc_convert_to_range(args, n-i, args_converted, opt);
        const rtosc_arg_val_t* input = conv ? args_converted : args;

        size_t tmp = rtosc_print_arg_val(input, buffer, bs, opt, &cols_used, (i == 0) ? NULL : (args-1));
        wrt += tmp;
        buffer += tmp;
        bs -= tmp;

        // these compute the newlines themselves
        if(! strchr("-asb", args->type))
        linebreak_check_after_write(&cols_used, &wrt, last_sep, &buffer, &bs,
                                    tmp, &args_written_this_line,
                                    opt->linelength);

        size_t inc = conv ? conv : next_arg_offset(args);
        i += inc;
        args += inc;
        if(i<n)
        {
            assert(sep_len < bs);
            last_sep = buffer;
            fast_strcpy(buffer, opt->sep, bs);
            cols_used += sep_len;
            wrt += sep_len;
            buffer += sep_len;
            bs -= sep_len;
        }
    }
    return wrt;
}